

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

QStringList * QDir::searchPaths(QString *prefix)

{
  long lVar1;
  bool bVar2;
  QString *in_RSI;
  QStringList *in_RDI;
  long in_FS_OFFSET;
  DirSearchPaths *conf;
  QReadLocker lock;
  QStringList *this;
  QStringList *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  this_00 = in_RDI;
  bVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dirSearchPaths>_>::
          exists((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dirSearchPaths>_>
                  *)0x27f0e8);
  if (bVar2) {
    QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dirSearchPaths>_>::operator*
              ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dirSearchPaths>_>
                *)0x27f122);
    QReadLocker::QReadLocker((QReadLocker *)this,(QReadWriteLock *)in_RDI);
    QHash<QString,_QList<QString>_>::value((QHash<QString,_QList<QString>_> *)this_00,in_RSI);
    QReadLocker::~QReadLocker((QReadLocker *)0x27f163);
  }
  else {
    memset(in_RDI,0,0x18);
    QList<QString>::QList((QList<QString> *)0x27f105);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QDir::searchPaths(const QString &prefix)
{
    if (!dirSearchPaths.exists())
        return QStringList();

    const DirSearchPaths &conf = *dirSearchPaths;
    const QReadLocker lock(&conf.mutex);
    return conf.paths.value(prefix);
}